

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

ggml_cgraph *
clip_image_build_graph
          (clip_ctx *ctx,clip_image_f32_batch *imgs,clip_image_size load_image_size,bool is_inf)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  pointer puVar5;
  __uniq_ptr_data<clip_image_f32,_clip_image_f32_deleter,_true,_true> _Var6;
  double dVar7;
  double dVar8;
  long lVar9;
  tuple<ggml_context_*,_ggml_context_deleter> tVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ggml_tensor *pos_h;
  ggml_tensor *pos_w;
  ggml_tensor *pgVar16;
  undefined8 uVar17;
  undefined4 *puVar18;
  ggml_cgraph *pgVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  float fVar26;
  float fVar27;
  double __x;
  ggml_context_ptr ctx0_ptr;
  undefined4 uVar28;
  __uniq_ptr_impl<ggml_context,_ggml_context_deleter> local_80;
  int local_74;
  ggml_cgraph *local_70;
  long local_68;
  ulong local_60;
  long local_58;
  pointer puStack_50;
  undefined1 local_48;
  undefined7 uStack_47;
  ulong local_40;
  long local_38;
  
  uVar28 = (undefined4)((uint7)uStack_47 >> 0x18);
  if (ctx->proj_type - PROJECTOR_TYPE_GEMMA3 < 2) {
    iVar21 = (ctx->vision_model).hparams.image_size;
    iVar25 = (ctx->vision_model).hparams.patch_size;
    iVar24 = (ctx->vision_model).hparams.hidden_size;
    lVar9 = (long)iVar24;
    iVar2 = (ctx->vision_model).hparams.n_head;
    lVar20 = (long)iVar2;
    if ((long)(imgs->entries).
              super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(imgs->entries).
              super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 8) {
      uVar11 = 0x188;
      goto LAB_0011e532;
    }
    uVar3 = (ctx->vision_model).hparams.n_layer;
    fVar1 = (ctx->vision_model).hparams.eps;
    puStack_50 = (ctx->buf_compute_meta).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_58 = (long)(ctx->buf_compute_meta).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puStack_50;
    local_48 = 1;
    tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
    super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>)
         ggml_init(ctx,imgs,(long)iVar24 % (long)iVar2 & 0xffffffff);
    local_80._M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
    super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
         (tuple<ggml_context_*,_ggml_context_deleter>)
         (tuple<ggml_context_*,_ggml_context_deleter>)
         tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl;
    local_70 = (ggml_cgraph *)
               ggml_new_graph(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
    uVar11 = ggml_new_tensor_3d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0,
                                (long)iVar21,(long)iVar21,3);
    ggml_set_name(uVar11,"inp_raw");
    ggml_set_input(uVar11);
    uVar11 = ggml_conv_2d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                          (ctx->vision_model).patch_embeddings_0,uVar11,iVar25,iVar25,0,0,1,
                          CONCAT44(uVar28,1));
    iVar21 = (iVar21 / iVar25) * (iVar21 / iVar25);
    uVar11 = ggml_reshape_2d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                             super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,iVar21
                             ,lVar9);
    uVar11 = ggml_transpose(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11);
    uVar11 = ggml_cont(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11);
    uVar11 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                      (ctx->vision_model).patch_bias);
    lVar12 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                      (ctx->vision_model).position_embeddings);
    if (0 < (int)uVar3) {
      lVar13 = (long)(iVar24 / iVar2);
      fVar26 = (float)(iVar24 / iVar2);
      local_68 = (ulong)uVar3 * 0xb0;
      lVar23 = 0;
      do {
        uVar11 = ggml_norm(fVar1,tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                 .super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,lVar12);
        uVar11 = ggml_mul(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                          *(undefined8 *)
                           ((long)&((ctx->vision_model).layers.
                                    super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ln_1_w + lVar23));
        uVar11 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                          *(undefined8 *)
                           ((long)&((ctx->vision_model).layers.
                                    super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ln_1_b + lVar23));
        uVar14 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              *(undefined8 *)
                               ((long)&((ctx->vision_model).layers.
                                        super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->q_w + lVar23),
                              uVar11);
        uVar14 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                          *(undefined8 *)
                           ((long)&((ctx->vision_model).layers.
                                    super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->q_b + lVar23));
        uVar14 = ggml_reshape_3d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                 .super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                                 lVar13,lVar20,iVar21);
        uVar14 = ggml_permute(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,0,2,1
                              ,3);
        uVar14 = ggml_cont(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14);
        uVar15 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              *(undefined8 *)
                               ((long)&((ctx->vision_model).layers.
                                        super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->k_w + lVar23),
                              uVar11);
        uVar15 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar15,
                          *(undefined8 *)
                           ((long)&((ctx->vision_model).layers.
                                    super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->k_b + lVar23));
        uVar15 = ggml_reshape_3d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                 .super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar15,
                                 lVar13,lVar20,iVar21);
        uVar15 = ggml_permute(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar15,0,2,1
                              ,3);
        uVar15 = ggml_cont(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar15);
        uVar11 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              *(undefined8 *)
                               ((long)&((ctx->vision_model).layers.
                                        super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->v_w + lVar23),
                              uVar11);
        uVar11 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                          *(undefined8 *)
                           ((long)&((ctx->vision_model).layers.
                                    super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->v_b + lVar23));
        uVar11 = ggml_reshape_3d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                 .super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                                 lVar13,lVar20,iVar21);
        uVar11 = ggml_permute(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,1,2,0
                              ,3);
        uVar11 = ggml_cont(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11);
        uVar14 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar15,
                              uVar14);
        fVar27 = SQRT(fVar26);
        if (fVar26 < 0.0) {
          fVar27 = sqrtf(fVar26);
        }
        uVar14 = ggml_soft_max_ext(1.0 / fVar27,
                                   tVar10.
                                   super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                   super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                                   0);
        uVar11 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                              uVar14);
        uVar11 = ggml_reshape_3d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                 .super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                                 lVar13,iVar21,lVar20);
        uVar11 = ggml_permute(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,0,2,1
                              ,3);
        uVar11 = ggml_cont_2d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,lVar9
                              ,iVar21);
        uVar11 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              *(undefined8 *)
                               ((long)&((ctx->vision_model).layers.
                                        super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->o_w + lVar23),
                              uVar11);
        uVar11 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                          *(undefined8 *)
                           ((long)&((ctx->vision_model).layers.
                                    super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->o_b + lVar23));
        uVar11 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,lVar12);
        uVar14 = ggml_norm(fVar1,tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                 .super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11);
        uVar14 = ggml_mul(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                          *(undefined8 *)
                           ((long)&((ctx->vision_model).layers.
                                    super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ln_2_w + lVar23));
        uVar14 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                          *(undefined8 *)
                           ((long)&((ctx->vision_model).layers.
                                    super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ln_2_b + lVar23));
        uVar14 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              *(undefined8 *)
                               ((long)&((ctx->vision_model).layers.
                                        super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->ff_i_w + lVar23),
                              uVar14);
        uVar14 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                          *(undefined8 *)
                           ((long)&((ctx->vision_model).layers.
                                    super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ff_i_b + lVar23));
        uVar14 = ggml_gelu(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14);
        uVar14 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              *(undefined8 *)
                               ((long)&((ctx->vision_model).layers.
                                        super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->ff_o_w + lVar23),
                              uVar14);
        uVar14 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                          *(undefined8 *)
                           ((long)&((ctx->vision_model).layers.
                                    super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ff_o_b + lVar23));
        lVar12 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,uVar14);
        lVar23 = lVar23 + 0xb0;
      } while (local_68 != lVar23);
    }
    if ((ctx->vision_model).post_ln_w != (ggml_tensor *)0x0) {
      uVar11 = ggml_norm(fVar1,tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,lVar12);
      ggml_set_name(uVar11,"post_ln");
      uVar11 = ggml_mul(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                        (ctx->vision_model).post_ln_w);
      lVar12 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                        (ctx->vision_model).post_ln_b);
    }
    if (ctx->proj_type == PROJECTOR_TYPE_IDEFICS3) {
      iVar21 = (ctx->vision_model).hparams.proj_scale_factor;
      uVar11 = *(undefined8 *)(lVar12 + 0x10);
      iVar25 = *(int *)(lVar12 + 0x18);
      __x = (double)iVar25;
      dVar7 = SQRT(__x);
      dVar8 = dVar7;
      if (__x < 0.0) {
        dVar8 = sqrt(__x);
        dVar7 = sqrt(__x);
      }
      if (iVar21 == 0) goto LAB_0011e553;
      iVar24 = (int)uVar11 * iVar21;
      uVar11 = ggml_reshape_4d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,lVar12,
                               (long)iVar24,(long)((int)dVar7 / iVar21),(long)(int)dVar8,1);
      uVar11 = ggml_permute(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,0,2,1,3
                           );
      uVar11 = ggml_cont(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11);
      lVar9 = (long)(iVar24 * iVar21);
      uVar11 = ggml_reshape_4d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                               lVar9,(long)((int)dVar8 / iVar21),(long)((int)dVar7 / iVar21),1);
      uVar11 = ggml_permute(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,0,2,1,3
                           );
      uVar11 = ggml_cont(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11);
      uVar11 = ggml_reshape_3d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                               lVar9,(long)(iVar25 / (iVar21 * iVar21)),1);
      uVar11 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            (ctx->vision_model).projection,uVar11);
LAB_0011e4ce:
      ggml_build_forward_expand(local_70,uVar11);
LAB_0011e4db:
      std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
                ((unique_ptr<ggml_context,_ggml_context_deleter> *)&local_80);
      return local_70;
    }
    if (ctx->proj_type == PROJECTOR_TYPE_GEMMA3) {
      dVar7 = (double)iVar21;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      iVar25 = (int)dVar7;
      iVar21 = iVar25 + 0xf;
      if (-1 < iVar25) {
        iVar21 = iVar25;
      }
      uVar11 = ggml_transpose(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,lVar12);
      uVar11 = ggml_cont(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11);
      uVar11 = ggml_reshape_4d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                               (long)iVar25,(long)iVar25,lVar9,1);
      iVar21 = iVar21 >> 4;
      lVar20 = ggml_pool_2d(0,0,tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,1,
                            iVar21,iVar21,iVar21,iVar21);
      uVar11 = ggml_reshape_3d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,lVar20,
                               *(long *)(lVar20 + 0x10) * *(long *)(lVar20 + 0x10),lVar9,1);
      uVar11 = ggml_transpose(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11);
      uVar11 = ggml_cont(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11);
      uVar11 = ggml_rms_norm(fVar1,tVar10.
                                   super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                   super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11)
      ;
      uVar11 = ggml_mul(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                        (ctx->vision_model).mm_soft_emb_norm_w);
      uVar14 = ggml_transpose(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              (ctx->vision_model).mm_input_proj_w);
      uVar14 = ggml_cont(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14);
      uVar11 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,uVar11)
      ;
      goto LAB_0011e4ce;
    }
  }
  else {
    if (ctx->proj_type != PROJECTOR_TYPE_PIXTRAL) {
      pgVar19 = clip_image_build_graph_legacy(ctx,imgs,load_image_size,is_inf);
      return pgVar19;
    }
    puVar5 = (imgs->entries).
             super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(imgs->entries).
              super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 == 8) {
      _Var6.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>._M_t.
      super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
      super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl =
           (puVar5->_M_t).super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>;
      iVar21 = *(int *)_Var6.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>._M_t.
                       super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
                       super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl;
      iVar25 = *(int *)((long)_Var6.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>.
                              _M_t.super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
                              super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl + 4);
      iVar24 = (ctx->vision_model).hparams.patch_size;
      uVar3 = (ctx->vision_model).hparams.n_layer;
      local_74 = iVar21 / iVar24;
      local_60 = (long)iVar25 / (long)iVar24 & 0xffffffff;
      iVar2 = (ctx->vision_model).hparams.hidden_size;
      local_68 = (long)iVar2;
      iVar4 = (ctx->vision_model).hparams.n_head;
      lVar20 = (long)iVar4;
      fVar1 = (ctx->vision_model).hparams.eps;
      puStack_50 = (ctx->buf_compute_meta).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      local_58 = (long)(ctx->buf_compute_meta).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puStack_50;
      local_48 = 1;
      tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>)
           ggml_init(ctx,lVar20,(long)iVar2 % (long)iVar4 & 0xffffffff);
      local_80._M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
           (tuple<ggml_context_*,_ggml_context_deleter>)
           (tuple<ggml_context_*,_ggml_context_deleter>)
           tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl;
      local_70 = (ggml_cgraph *)
                 ggml_new_graph(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
      uVar11 = ggml_new_tensor_3d(tVar10.
                                  super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0,
                                  (long)iVar21,(long)iVar25,3);
      ggml_set_name(uVar11,"inp_raw");
      ggml_set_input(uVar11);
      uVar22 = (int)local_60 * local_74;
      lVar9 = (long)(int)uVar22;
      pos_h = (ggml_tensor *)
              ggml_new_tensor_1d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                 .super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0x1a);
      ggml_set_name(pos_h,"pos_h");
      ggml_set_input(pos_h);
      pos_w = (ggml_tensor *)
              ggml_new_tensor_1d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                 .super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0x1a,
                                 lVar9);
      ggml_set_name(pos_w,"pos_w");
      ggml_set_input(pos_w);
      local_40 = (ulong)uVar22;
      uVar11 = ggml_conv_2d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            (ctx->vision_model).patch_embeddings_0,uVar11,iVar24,iVar24,0,0,1,
                            CONCAT44(uVar28,1));
      uVar11 = ggml_reshape_2d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                               lVar9,local_68);
      uVar11 = ggml_transpose(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11);
      uVar11 = ggml_cont(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11);
      uVar11 = ggml_rms_norm(fVar1,tVar10.
                                   super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                   super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11)
      ;
      uVar11 = ggml_mul(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                        (ctx->vision_model).pre_ln_w);
      if (0 < (int)uVar3) {
        lVar12 = (long)(iVar2 / iVar4);
        fVar26 = (float)(iVar2 / iVar4);
        local_38 = (ulong)uVar3 * 0xb0;
        lVar13 = 0;
        do {
          uVar14 = ggml_rms_norm(fVar1,tVar10.
                                       super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 uVar11);
          uVar14 = ggml_mul(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                            *(undefined8 *)
                             ((long)&((ctx->vision_model).layers.
                                      super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->ln_1_w + lVar13));
          uVar15 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                *(undefined8 *)
                                 ((long)&((ctx->vision_model).layers.
                                          super__Vector_base<clip_layer,_std::allocator<clip_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->q_w + lVar13),
                                uVar14);
          pgVar16 = (ggml_tensor *)
                    ggml_reshape_3d(tVar10.
                                    super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                    super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar15
                                    ,lVar12,lVar20,lVar9);
          pgVar16 = build_rope_2d((ggml_context *)
                                  tVar10.
                                  super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,pgVar16,
                                  pos_h,pos_w,(ctx->vision_model).hparams.rope_theta);
          uVar15 = ggml_permute(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,pgVar16,0,
                                2,1,3);
          uVar15 = ggml_cont(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                             super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar15);
          uVar17 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                *(undefined8 *)
                                 ((long)&((ctx->vision_model).layers.
                                          super__Vector_base<clip_layer,_std::allocator<clip_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->k_w + lVar13),
                                uVar14);
          pgVar16 = (ggml_tensor *)
                    ggml_reshape_3d(tVar10.
                                    super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                    super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar17
                                    ,lVar12,lVar20,lVar9);
          pgVar16 = build_rope_2d((ggml_context *)
                                  tVar10.
                                  super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,pgVar16,
                                  pos_h,pos_w,(ctx->vision_model).hparams.rope_theta);
          uVar17 = ggml_permute(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,pgVar16,0,
                                2,1,3);
          uVar17 = ggml_cont(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                             super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar17);
          uVar14 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                *(undefined8 *)
                                 ((long)&((ctx->vision_model).layers.
                                          super__Vector_base<clip_layer,_std::allocator<clip_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->v_w + lVar13),
                                uVar14);
          uVar14 = ggml_reshape_3d(tVar10.
                                   super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                   super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                                   lVar12,lVar20,lVar9);
          uVar14 = ggml_permute(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,1,2
                                ,0,3);
          uVar14 = ggml_cont(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                             super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14);
          uVar15 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar17,
                                uVar15);
          fVar27 = SQRT(fVar26);
          if (fVar26 < 0.0) {
            fVar27 = sqrtf(fVar26);
          }
          uVar15 = ggml_soft_max_ext(1.0 / fVar27,0,
                                     tVar10.
                                     super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                     super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                     uVar15,0);
          uVar14 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                                uVar15);
          uVar14 = ggml_reshape_3d(tVar10.
                                   super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                   super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                                   lVar12,lVar9,lVar20);
          uVar14 = ggml_permute(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,0,2
                                ,1,3);
          uVar14 = ggml_cont_2d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                                local_68,lVar9);
          uVar14 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                *(undefined8 *)
                                 ((long)&((ctx->vision_model).layers.
                                          super__Vector_base<clip_layer,_std::allocator<clip_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->o_w + lVar13),
                                uVar14);
          uVar11 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,uVar11)
          ;
          uVar14 = ggml_rms_norm(fVar1,tVar10.
                                       super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                 uVar11);
          uVar14 = ggml_mul(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                            *(undefined8 *)
                             ((long)&((ctx->vision_model).layers.
                                      super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->ln_2_w + lVar13));
          uVar15 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                *(undefined8 *)
                                 ((long)&((ctx->vision_model).layers.
                                          super__Vector_base<clip_layer,_std::allocator<clip_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->ff_gate_w +
                                 lVar13),uVar14);
          uVar14 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                *(undefined8 *)
                                 ((long)&((ctx->vision_model).layers.
                                          super__Vector_base<clip_layer,_std::allocator<clip_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->ff_up_w +
                                 lVar13),uVar14);
          uVar15 = ggml_silu(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                             super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar15);
          uVar14 = ggml_mul(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,uVar15)
          ;
          uVar14 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                *(undefined8 *)
                                 ((long)&((ctx->vision_model).layers.
                                          super__Vector_base<clip_layer,_std::allocator<clip_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->ff_down_w +
                                 lVar13),uVar14);
          uVar11 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,uVar14)
          ;
          lVar13 = lVar13 + 0xb0;
        } while (local_38 != lVar13);
      }
      uVar11 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            (ctx->vision_model).mm_1_w,uVar11);
      uVar11 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                        (ctx->vision_model).mm_1_b);
      uVar11 = ggml_gelu(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11);
      uVar11 = ggml_mul_mat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            (ctx->vision_model).mm_2_w,uVar11);
      puVar18 = (undefined4 *)
                ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,
                         (ctx->vision_model).mm_2_b);
      lVar9 = (long)(int)puVar18[4];
      lVar20 = (long)(int)local_60;
      uVar11 = ggml_reshape_3d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,puVar18,
                               lVar9,(long)local_74,lVar20);
      uVar14 = ggml_new_tensor_3d(tVar10.
                                  super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,*puVar18
                                  ,lVar9,1,lVar20);
      uVar14 = ggml_scale(0,tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14);
      uVar14 = ggml_add(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar14,
                        (ctx->vision_model).token_embd_img_break);
      puVar18 = (undefined4 *)
                ggml_concat(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar11,uVar14,
                            1);
      uVar11 = ggml_row_size(*puVar18,lVar9);
      uVar11 = ggml_view_2d(tVar10.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,puVar18,lVar9,
                            (long)((int)local_60 + (int)local_40 + -1),uVar11,0);
      ggml_build_forward_expand(local_70,uVar11);
      goto LAB_0011e4db;
    }
    uVar11 = 0x275;
LAB_0011e532:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
               ,uVar11,"GGML_ASSERT(%s) failed","imgs.entries.size() == 1");
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
             ,0x223,"SigLIP: Unsupported projector type");
LAB_0011e553:
  uVar11 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                      ,0x212,"GGML_ASSERT(%s) failed","scale_factor != 0");
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)&local_80);
  _Unwind_Resume(uVar11);
}

Assistant:

static ggml_cgraph * clip_image_build_graph(clip_ctx * ctx, const clip_image_f32_batch & imgs, struct clip_image_size load_image_size, bool is_inf = false) {
    ggml_cgraph * res;
    switch (ctx->proj_type) {
        case PROJECTOR_TYPE_GEMMA3:
        case PROJECTOR_TYPE_IDEFICS3:
            {
                res = clip_image_build_graph_siglip(ctx, imgs);
            } break;
        case PROJECTOR_TYPE_PIXTRAL:
            {
                res = clip_image_build_graph_pixtral(ctx, imgs);
            } break;
        default:
            {
                // TODO: we should have one build_* function per model
                res = clip_image_build_graph_legacy(ctx, imgs, load_image_size, is_inf);
            } break;
    }
    return res;
}